

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgroupbox.cpp
# Opt level: O1

void __thiscall QGroupBox::focusInEvent(QGroupBox *this,QFocusEvent *fe)

{
  QGroupBoxPrivate *this_00;
  FocusPolicy FVar1;
  FocusReason reason;
  
  this_00 = *(QGroupBoxPrivate **)&(this->super_QWidget).field_0x8;
  FVar1 = QWidget::focusPolicy(&this->super_QWidget);
  if (FVar1 != NoFocus) {
    QWidget::focusInEvent(&this->super_QWidget,fe);
    return;
  }
  reason = QFocusEvent::reason();
  QGroupBoxPrivate::_q_fixFocus(this_00,reason);
  return;
}

Assistant:

void QGroupBox::focusInEvent(QFocusEvent *fe)
{ // note no call to super
    Q_D(QGroupBox);
    if (focusPolicy() == Qt::NoFocus) {
        d->_q_fixFocus(fe->reason());
    } else {
        QWidget::focusInEvent(fe);
    }
}